

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::BlitColorConversionCase::compare
          (BlitColorConversionCase *this,Surface *reference,Surface *result)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  RGBA RVar3;
  RGBA b;
  TextureFormat format;
  TextureFormat format_00;
  TextureFormat dstFormat;
  TextureFormat srcFormat;
  RGBA local_1c4;
  TextureFormat local_1c0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [384];
  
  format = glu::mapGLInternalFormat(this->m_srcFormat);
  local_1b8 = format;
  format_00 = glu::mapGLInternalFormat(this->m_dstFormat);
  local_1c0 = format_00;
  bVar1 = tcu::isSRGB(format);
  bVar2 = tcu::isSRGB(format_00);
  if (bVar2) {
    RVar3 = FboTestUtil::getToSRGBConversionThreshold(&local_1b8,&local_1c0);
  }
  else {
    local_1b0._0_4_ = FboTestUtil::getFormatThreshold(&local_1b8);
    RVar3 = tcu::operator*((RGBA *)local_1b0,bVar1 + 1);
    b = FboTestUtil::getFormatThreshold(&local_1c0);
    RVar3 = tcu::max(RVar3,b);
  }
  local_1b0._0_8_ =
       ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1c4.m_value = RVar3.m_value;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"threshold = ");
  tcu::operator<<((ostream *)this_00,RVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  bVar1 = tcu::pixelThresholdCompare
                    (((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,"Result","Image comparison result",reference,result,
                     &local_1c4,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::TextureFormat	srcFormat	= glu::mapGLInternalFormat(m_srcFormat);
		const tcu::TextureFormat	dstFormat	= glu::mapGLInternalFormat(m_dstFormat);
		const bool					srcIsSRGB	= tcu::isSRGB(srcFormat);
		const bool					dstIsSRGB	= tcu::isSRGB(dstFormat);

		tcu::RGBA					threshold;

		if (dstIsSRGB)
		{
			threshold = getToSRGBConversionThreshold(srcFormat, dstFormat);
		}
		else
		{
			const tcu::RGBA	srcMaxDiff	= getFormatThreshold(srcFormat) * (srcIsSRGB ? 2 : 1);
			const tcu::RGBA	dstMaxDiff	= getFormatThreshold(dstFormat);

			threshold = tcu::max(srcMaxDiff, dstMaxDiff);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "threshold = " << threshold << tcu::TestLog::EndMessage;
		return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, tcu::COMPARE_LOG_RESULT);
	}